

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

Var * __thiscall
Js::InlinedFrameWalker::GetArgv(InlinedFrameWalker *this,bool includeThis,bool boxArgsAndDeepCopy)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  ScriptContext *this_00;
  Recycler *pRVar5;
  Var *local_78;
  size_t i;
  TrackAllocData local_60;
  InlineeCallInfo *local_38;
  Var *args;
  size_t argCount;
  InlinedFrame *pIStack_20;
  uint firstArg;
  InlinedFrame *currentFrame;
  bool boxArgsAndDeepCopy_local;
  InlinedFrameWalker *pIStack_10;
  bool includeThis_local;
  InlinedFrameWalker *this_local;
  
  currentFrame._6_1_ = boxArgsAndDeepCopy;
  currentFrame._7_1_ = includeThis;
  pIStack_10 = this;
  pIStack_20 = GetCurrentFrame(this);
  if (pIStack_20 == (InlinedFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x567,"(currentFrame)","currentFrame");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  argCount._4_4_ = (uint)((currentFrame._7_1_ & 1) == 0);
  sVar4 = GetArgc(this);
  args = (Var *)(sVar4 - argCount._4_4_);
  if ((currentFrame._6_1_ & 1) == 0) {
    local_38 = &pIStack_20[1].super_InlinedFrameLayout.callInfo + argCount._4_4_;
  }
  else {
    this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this->parentFunction);
    pRVar5 = ScriptContext::GetRecycler(this_00);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&void*::typeinfo,0,(size_t)args,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
               ,0x572);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_60);
    local_38 = (InlineeCallInfo *)
               Memory::AllocateArray<Memory::Recycler,void*,false>
                         ((Memory *)pRVar5,(Recycler *)Memory::Recycler::Alloc,0,(size_t)args);
    for (local_78 = (Var *)0x0; local_78 < args; local_78 = (Var *)((long)local_78 + 1)) {
      local_38[(long)local_78] =
           (&pIStack_20[1].super_InlinedFrameLayout.callInfo)
           [(ulong)argCount._4_4_ + (long)local_78];
    }
    FinalizeStackValues(this,(Var *)local_38,(size_t)args,true);
  }
  return (Var *)local_38;
}

Assistant:

Js::Var *InlinedFrameWalker::GetArgv(bool includeThis, bool boxArgsAndDeepCopy) const
    {
        InlinedFrameWalker::InlinedFrame *const currentFrame = GetCurrentFrame();
        Assert(currentFrame);

        uint firstArg = includeThis ? InlinedFrameArgIndex_This : InlinedFrameArgIndex_SecondScriptArg;
        size_t argCount = this->GetArgc() - firstArg;
        Js::Var *args;
        if (!boxArgsAndDeepCopy)
        {
            args = &currentFrame->argv[firstArg];
        }
        else
        {
            args = RecyclerNewArray(parentFunction->GetScriptContext()->GetRecycler(), Js::Var, argCount);
            for (size_t i = 0; i < argCount; i++)
            {
                args[i] = currentFrame->argv[firstArg + i];
            }

            this->FinalizeStackValues(args, argCount, true /*deepCopy*/);
        }

        return args;
    }